

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint8_t *puVar1;
  pointer ptVar2;
  int i;
  uint uVar3;
  uint uVar4;
  result_type rVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int local_2814;
  uint local_2810;
  int local_280c;
  int local_2808;
  int local_2804;
  uniform_int_distribution<int> dis;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  sigaction act;
  random_device rd;
  mt19937 gen;
  
  if (argc < 3) {
    __assert_fail("argc >= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/yuyichao[P]explore/general_c/mprotect_mt/main.cpp"
                  ,0x75,"int main(int, char **)");
  }
  memset((sigaction *)&act,0,0x98);
  sigemptyset((sigset_t *)&act.sa_mask);
  act.__sigaction_handler.sa_handler = segv_handler;
  act.sa_flags = 4;
  sigaction(0xb,(sigaction *)&act,(sigaction *)0x0);
  uVar3 = atoi(argv[1]);
  local_2808 = atoi(argv[2]);
  uVar8 = 0;
  if (0 < (int)uVar3) {
    uVar8 = (ulong)uVar3;
  }
  if (local_2808 < 1) {
    local_2808 = 0;
  }
  local_280c = uVar3 - 1;
  local_2810 = uVar3;
  for (local_2804 = 0; uVar10 = local_2810, local_2804 != local_2808; local_2804 = local_2804 + 1) {
    thread_done = false;
    std::vector<thread_data_t,_std::allocator<thread_data_t>_>::resize
              (&thread_datas,(long)(int)uVar3);
    std::random_device::random_device(&rd);
    uVar4 = std::random_device::_M_getval();
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(&gen,(ulong)uVar4);
    dis._M_param._M_a = 0;
    dis._M_param._M_b = local_280c;
    for (lVar7 = 0;
        ptVar2 = thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>.
                 _M_impl.super__Vector_impl_data._M_start, uVar8 * 0x98 - lVar7 != 0;
        lVar7 = lVar7 + 0x98) {
      puVar1 = (thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>.
                _M_impl.super__Vector_impl_data._M_start)->padding + lVar7 + 0x80;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      (&ptVar2->triggered)[lVar7] = false;
      rVar5 = std::uniform_int_distribution<int>::operator()(&dis,&gen);
      *(result_type *)((long)&ptVar2->other_id + lVar7) = rVar5;
    }
    page = (uint32_t *)mmap((void *)0x0,0x1000,1,0x22,-1,0);
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (local_2814 = 0; local_2814 < (int)uVar10; local_2814 = local_2814 + 1) {
      std::vector<std::thread,std::allocator<std::thread>>::emplace_back<void(&)(int),int&>
                ((vector<std::thread,std::allocator<std::thread>> *)&threads,run_thread_loop,
                 &local_2814);
    }
    usleep(100);
    mprotect(page,0x1000,0);
    for (uVar6 = 0; uVar6 != uVar8; uVar6 = uVar6 + 1) {
      do {
      } while ((thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar6].triggered & 1U) == 0);
    }
    mprotect(page,0x1000,3);
    *page = 1;
    thread_done = true;
    lVar7 = 0x12;
    uVar10 = 0;
    for (lVar9 = 0; uVar8 * 8 - lVar9 != 0; lVar9 = lVar9 + 8) {
      if ((*(uintptr_t *)
            ((thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>._M_impl
              .super__Vector_impl_data._M_start)->padding + lVar7 * 8 + -8) !=
           thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>._M_impl.
           super__Vector_impl_data._M_start
           [*(int *)((thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>
                      ._M_impl.super__Vector_impl_data._M_start)->padding + lVar7 * 8)].self_count)
         && (*(uintptr_t *)
              ((thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>.
                _M_impl.super__Vector_impl_data._M_start)->padding + lVar7 * 8 + -8) + 1 !=
             thread_datas.super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>._M_impl.
             super__Vector_impl_data._M_start
             [*(int *)((thread_datas.
                        super__Vector_base<thread_data_t,_std::allocator<thread_data_t>_>._M_impl.
                        super__Vector_impl_data._M_start)->padding + lVar7 * 8)].self_count)) {
        uVar10 = uVar10 + 1;
        printf("%d, %zu, %zu\n");
      }
      std::thread::join();
      lVar7 = lVar7 + 0x13;
    }
    munmap(page,0x1000);
    page = (uint32_t *)0x0;
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
    std::random_device::~random_device(&rd);
    if (uVar10 != 0) {
      printf("%d\n",(ulong)uVar10);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    assert(argc >= 3);
    struct sigaction act;
    memset(&act, 0, sizeof(struct sigaction));
    sigemptyset(&act.sa_mask);
    act.sa_sigaction = segv_handler;
    act.sa_flags = SA_SIGINFO;
    sigaction(SIGSEGV, &act, NULL);
    int nt = atoi(argv[1]);
    int n = atoi(argv[2]);
    for (int i = 0;i < n;i++) {
        if (int violation = run_n_threads(nt)) {
            printf("%d\n", violation);
        }
    }
    return 0;
}